

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

word * Sfm_NodeReadTruth(Sfm_Ntk_t *p,int i)

{
  Vec_Wrd_t *p_00;
  int iVar1;
  word *local_20;
  int i_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjFaninNum(p,i);
  if (iVar1 < 7) {
    local_20 = Vec_WrdEntryP(p->vTruths,i);
  }
  else {
    p_00 = p->vTruths2;
    iVar1 = Vec_IntEntry(p->vStarts,i);
    local_20 = Vec_WrdEntryP(p_00,iVar1);
  }
  return local_20;
}

Assistant:

word * Sfm_NodeReadTruth( Sfm_Ntk_t * p, int i )
{
    return Sfm_ObjFaninNum(p, i) <= 6 ? Vec_WrdEntryP( p->vTruths, i ) : Vec_WrdEntryP( p->vTruths2, Vec_IntEntry(p->vStarts, i) );
}